

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_index.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  undefined8 uVar1;
  ostream *poVar2;
  allocator local_91;
  string local_90 [32];
  int local_70;
  undefined1 local_6c [4];
  ErrorCode code;
  Options options;
  Index *index;
  allocator local_39;
  string local_38 [8];
  string index_file;
  char **argv_local;
  int argc_local;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"testing kv index...");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"test.idx",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  kvindex::Options::Options((Options *)local_6c);
  local_70 = kvindex::Index::Open(local_38,(Options *)local_6c,(Index **)&options.disk_page_size);
  if (local_70 == 0) {
    testBasicPutGet((Index *)options._12_8_);
    generateDataFile("test.data");
    uVar1 = options._12_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"test.data",&local_91);
    (*(code *)**(undefined8 **)uVar1)(uVar1,local_90);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    testMemAndDiskPage((Index *)options._12_8_);
    poVar2 = std::operator<<((ostream *)&std::cout,"success");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_38);
    return 0;
  }
  __assert_fail("kvindex::kOk == code",
                "/workspace/llm4binary/github/license_all_cmakelists_25/lxyhcx[P]kv_index/test/test_index.cpp"
                ,0x56,"int main(int, char **)");
}

Assistant:

int main(int argc, char *argv[])
{
    cout << "testing kv index..." << endl;
    string index_file("test.idx");
    kvindex::Index* index;
    kvindex::Options options;
    kvindex::ErrorCode code = kvindex::Index::Open(index_file, options, &index);
    assert(kvindex::kOk == code);

    testBasicPutGet(index);

    generateDataFile("test.data");
    index->LoadDataFrom("test.data");

    // After load data from data file, test get some keys in data file,
    // including keys in mem pages and disk pages.
    testMemAndDiskPage(index);

    cout << "success" << endl;
    return 0;
}